

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O2

void write_to_file(string *file,PFT_PROGRAM_DATA ftData)

{
  ofstream output_file;
  CONFIG_DATA config;
  
  std::ofstream::ofstream(&output_file,(string *)file,_S_bin);
  ft_to_config(&config,ftData);
  std::ostream::write((char *)&output_file,(long)&config);
  std::ostream::write((char *)&output_file,0x158540);
  std::ostream::write((char *)&output_file,0x158560);
  std::ostream::write((char *)&output_file,0x158570);
  std::ostream::write((char *)&output_file,0x1585b0);
  std::ofstream::close();
  std::ofstream::~ofstream(&output_file);
  return;
}

Assistant:

void write_to_file(const string& file, PFT_PROGRAM_DATA ftData) {
    ofstream output_file(file, ios::binary);
    CONFIG_DATA config;
    ft_to_config(&config, ftData);
    output_file.write((char *) &config, sizeof(CONFIG_DATA));
    output_file.write(ManufacturerBuf, sizeof(ManufacturerBuf));
    output_file.write(ManufacturerIdBuf, sizeof(ManufacturerIdBuf));
    output_file.write(DescriptionBuf, sizeof(DescriptionBuf));
    output_file.write(SerialNumberBuf, sizeof(SerialNumberBuf));
    output_file.close();
}